

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_ObjComputeLevelR(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  Vec_Int_t *pVVar3;
  int local_20;
  int local_1c;
  int Level;
  int k;
  int iFanout;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
    iVar1 = Vec_IntSize(pVVar3);
    if (iVar1 <= local_1c) break;
    pVVar3 = Vec_WecEntry(&p->vFanouts,iObj);
    iVar1 = Vec_IntEntry(pVVar3,local_1c);
    AVar2 = Acb_ObjType(p,iVar1);
    if (AVar2 != ABC_OPER_NONE) {
      iVar1 = Acb_ObjLevelR(p,iVar1);
      local_20 = Abc_MaxInt(local_20,iVar1);
    }
    local_1c = local_1c + 1;
  }
  iVar1 = Acb_ObjIsCio(p,iObj);
  iVar1 = Acb_ObjSetLevelR(p,iObj,local_20 + (uint)((iVar1 != 0 ^ 0xffU) & 1));
  return iVar1;
}

Assistant:

int Acb_ObjComputeLevelR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Level = 0;
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iFanout) );
    return Acb_ObjSetLevelR( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}